

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  undefined1 local_f8 [8];
  stbi__context s;
  int len_local;
  stbi_uc *buffer_local;
  
  s.img_buffer_original_end._4_4_ = len;
  stbi__start_mem((stbi__context *)local_f8,buffer,len);
  iVar1 = stbi__hdr_test((stbi__context *)local_f8);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_memory(stbi_uc const *buffer, int len)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(buffer);
   STBI_NOTUSED(len);
   return 0;
   #endif
}